

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_call(HSQUIRRELVM v,SQInteger params,SQBool retval,SQBool raiseerror)

{
  bool bVar1;
  SQObjectPtr *closure;
  SQRESULT SVar2;
  SQObjectPtr res;
  
  res.super_SQObject._type = OT_NULL;
  res.super_SQObject._unVal.pTable = (SQTable *)0x0;
  closure = SQVM::GetUp(v,~params);
  bVar1 = SQVM::Call(v,closure,params,v->_top - params,&res,(ulong)(raiseerror != 0));
  if (bVar1) {
    if (v->_suspended == 0) {
      SQVM::Pop(v,params);
    }
    if (retval != 0) {
      SQVM::Push(v,&res);
    }
    SVar2 = 0;
  }
  else {
    SQVM::Pop(v,params);
    SVar2 = -1;
  }
  SQObjectPtr::~SQObjectPtr(&res);
  return SVar2;
}

Assistant:

SQRESULT sq_call(HSQUIRRELVM v,SQInteger params,SQBool retval,SQBool raiseerror)
{
    SQObjectPtr res;
    if(v->Call(v->GetUp(-(params+1)),params,v->_top-params,res,raiseerror?true:false)){

        if(!v->_suspended) {
            v->Pop(params);//pop args
        }
        if(retval){
            v->Push(res); return SQ_OK;
        }
        return SQ_OK;
    }
    else {
        v->Pop(params);
        return SQ_ERROR;
    }
    if(!v->_suspended)
        v->Pop(params);
    return sq_throwerror(v,_SC("call failed"));
}